

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcurrentQueue.h
# Opt level: O0

size_t __thiscall
moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducer::
get_block_index_index_for_index
          (ImplicitProducer *this,index_t index,BlockIndexHeader **localBlockIndex)

{
  long lVar1;
  __pointer_type pBVar2;
  long *plVar3;
  long *in_RDX;
  ulong in_RSI;
  size_t idx;
  size_t offset;
  __int_type tailBase;
  __int_type tail;
  memory_order __b_1;
  memory_order __b;
  memory_order in_stack_ffffffffffffff84;
  atomic<moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducer::BlockIndexHeader_*>
  *in_stack_ffffffffffffff88;
  
  pBVar2 = std::
           atomic<moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducer::BlockIndexHeader_*>
           ::load(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
  *in_RDX = (long)pBVar2;
  plVar3 = (long *)(*in_RDX + 8);
  std::operator&(memory_order_acquire,__memory_order_mask);
  lVar1 = *plVar3;
  plVar3 = *(long **)(*(long *)(*in_RDX + 0x18) + lVar1 * 8);
  std::operator&(memory_order_relaxed,__memory_order_mask);
  return lVar1 + ((in_RSI & 0xffffffffffffffe0) - *plVar3 >> 5) & *(long *)*in_RDX - 1U;
}

Assistant:

inline size_t get_block_index_index_for_index(index_t index, BlockIndexHeader*& localBlockIndex) const
        {
#if MCDBGQ_NOLOCKFREE_IMPLICITPRODBLOCKINDEX
            debug::DebugLock lock(mutex);
#endif
            index &= ~static_cast<index_t>(BLOCK_SIZE - 1);
            localBlockIndex = blockIndex.load(std::memory_order_acquire);
            auto tail = localBlockIndex->tail.load(std::memory_order_acquire);
            auto tailBase = localBlockIndex->index[tail]->key.load(std::memory_order_relaxed);
            assert(tailBase != INVALID_BLOCK_BASE);
            // Note: Must use division instead of shift because the index may wrap around, causing a negative
            // offset, whose negativity we want to preserve
            auto offset = static_cast<size_t>(static_cast<typename std::make_signed<index_t>::type>(index - tailBase) / BLOCK_SIZE);
            size_t idx = (tail + offset) & (localBlockIndex->capacity - 1);
            assert(localBlockIndex->index[idx]->key.load(std::memory_order_relaxed) == index && localBlockIndex->index[idx]->value.load(std::memory_order_relaxed) != nullptr);
            return idx;
        }